

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

HierarchicalValueExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::HierarchicalValueExpression,slang::ast::Scope_const&,slang::ast::ValueSymbol_const&,slang::ast::HierarchicalReference_const&,slang::SourceRange&>
          (BumpAllocator *this,Scope *args,ValueSymbol *args_1,HierarchicalReference *args_2,
          SourceRange *args_3)

{
  HierarchicalValueExpression *this_00;
  
  this_00 = (HierarchicalValueExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((HierarchicalValueExpression *)this->endPtr < this_00 + 1) {
    this_00 = (HierarchicalValueExpression *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  ast::HierarchicalValueExpression::HierarchicalValueExpression(this_00,args,args_1,args_2,*args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }